

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::
     ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  undefined8 *puVar1;
  ArgMinMaxNState<duckdb::MinMaxStringValue,_duckdb::MinMaxFixedValue<int>,_duckdb::GreaterThan>
  *this;
  ulong uVar2;
  InvalidInputException *pIVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  TYPE arg_val;
  TYPE val_val;
  UnifiedVectorFormat n_format;
  long local_148;
  long local_140;
  UnifiedVectorFormat arg_format;
  long local_100;
  long local_f8;
  UnifiedVectorFormat val_format;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat state_format;
  long local_70;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&val_format);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&arg_format);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&n_format);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&state_format);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)(inputs + 0x68),(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)(inputs + 0xd0),(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  uVar6 = 0;
  do {
    if (count == uVar6) {
      UnifiedVectorFormat::~UnifiedVectorFormat(&state_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&n_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&arg_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&val_format);
      return;
    }
    uVar5 = uVar6;
    if (*_arg_format != 0) {
      uVar5 = (ulong)*(uint *)(*_arg_format + uVar6 * 4);
    }
    uVar4 = uVar6;
    if (*_val_format != 0) {
      uVar4 = (ulong)*(uint *)(*_val_format + uVar6 * 4);
    }
    if (((local_f8 == 0) || ((*(ulong *)(local_f8 + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) != 0))
       && ((local_b0 == 0 || ((*(ulong *)(local_b0 + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0))
          )) {
      uVar2 = uVar6;
      if (*_state_format != 0) {
        uVar2 = (ulong)*(uint *)(*_state_format + uVar6 * 4);
      }
      this = *(ArgMinMaxNState<duckdb::MinMaxStringValue,_duckdb::MinMaxFixedValue<int>,_duckdb::GreaterThan>
               **)(local_70 + uVar2 * 8);
      if (this->is_initialized == false) {
        uVar2 = uVar6;
        if (*_n_format != 0) {
          uVar2 = (ulong)*(uint *)(*_n_format + uVar6 * 4);
        }
        if (local_140 != 0) {
          if ((*(ulong *)(local_140 + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) == 0) {
            pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&val_val,
                       "Invalid input for arg_min/arg_max: n value cannot be NULL",
                       (allocator *)&arg_val);
            duckdb::InvalidInputException::InvalidInputException(pIVar3,(string *)&val_val);
            __cxa_throw(pIVar3,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        uVar2 = *(ulong *)(local_148 + uVar2 * 8);
        if ((long)uVar2 < 1) {
          pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&val_val,"Invalid input for arg_min/arg_max: n value must be > 0",
                     (allocator *)&arg_val);
          duckdb::InvalidInputException::InvalidInputException(pIVar3,(string *)&val_val);
          __cxa_throw(pIVar3,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (999999 < uVar2) {
          pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&val_val,"Invalid input for arg_min/arg_max: n value must be < %d",
                     (allocator *)&arg_val);
          InvalidInputException::InvalidInputException<long>(pIVar3,(string *)&val_val,1000000);
          __cxa_throw(pIVar3,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        ArgMinMaxNState<duckdb::MinMaxStringValue,_duckdb::MinMaxFixedValue<int>,_duckdb::GreaterThan>
        ::Initialize(this,aggr_input->allocator,uVar2);
      }
      arg_val = *(TYPE *)(local_100 + uVar5 * 4);
      puVar1 = (undefined8 *)(local_b8 + uVar4 * 0x10);
      val_val.value._0_8_ = *puVar1;
      val_val.value.pointer.ptr = (char *)puVar1[1];
      BinaryAggregateHeap<int,_duckdb::string_t,_duckdb::GreaterThan>::Insert
                (&this->heap,aggr_input->allocator,&arg_val,&val_val);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static void ArgMinMaxNUpdate(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count, Vector &state_vector,
                             idx_t count) {

	auto &val_vector = inputs[0];
	auto &arg_vector = inputs[1];
	auto &n_vector = inputs[2];

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat arg_format;
	UnifiedVectorFormat n_format;
	UnifiedVectorFormat state_format;

	auto val_extra_state = STATE::VAL_TYPE::CreateExtraState(val_vector, count);
	auto arg_extra_state = STATE::ARG_TYPE::CreateExtraState(arg_vector, count);

	STATE::VAL_TYPE::PrepareData(val_vector, count, val_extra_state, val_format);
	STATE::ARG_TYPE::PrepareData(arg_vector, count, arg_extra_state, arg_format);

	n_vector.ToUnifiedFormat(count, n_format);
	state_vector.ToUnifiedFormat(count, state_format);

	auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);

	for (idx_t i = 0; i < count; i++) {
		const auto arg_idx = arg_format.sel->get_index(i);
		const auto val_idx = val_format.sel->get_index(i);
		if (!arg_format.validity.RowIsValid(arg_idx) || !val_format.validity.RowIsValid(val_idx)) {
			continue;
		}
		const auto state_idx = state_format.sel->get_index(i);
		auto &state = *states[state_idx];

		// Initialize the heap if necessary and add the input to the heap
		if (!state.is_initialized) {
			static constexpr int64_t MAX_N = 1000000;
			const auto nidx = n_format.sel->get_index(i);
			if (!n_format.validity.RowIsValid(nidx)) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value cannot be NULL");
			}
			const auto nval = UnifiedVectorFormat::GetData<int64_t>(n_format)[nidx];
			if (nval <= 0) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be > 0");
			}
			if (nval >= MAX_N) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be < %d", MAX_N);
			}
			state.Initialize(aggr_input.allocator, UnsafeNumericCast<idx_t>(nval));
		}

		// Now add the input to the heap
		auto arg_val = STATE::ARG_TYPE::Create(arg_format, arg_idx);
		auto val_val = STATE::VAL_TYPE::Create(val_format, val_idx);

		state.heap.Insert(aggr_input.allocator, arg_val, val_val);
	}
}